

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.cpp
# Opt level: O0

vector<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
* __thiscall
Corrade::Utility::ConfigurationGroup::groups
          (vector<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
           *__return_storage_ptr__,ConfigurationGroup *this,string *name)

{
  bool bVar1;
  __type _Var2;
  reference __lhs;
  Group *group;
  iterator __end2;
  iterator __begin2;
  vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
  *__range2;
  string *name_local;
  ConfigurationGroup *this_local;
  vector<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
  *found;
  
  std::
  vector<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
  ::vector(__return_storage_ptr__);
  __end2 = std::
           vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
           ::begin(&this->_groups);
  group = (Group *)std::
                   vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                   ::end(&this->_groups);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
                                     *)&group), bVar1) {
    __lhs = __gnu_cxx::
            __normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
            ::operator*(&__end2);
    _Var2 = std::operator==(&__lhs->name,name);
    if (_Var2) {
      std::
      vector<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
      ::push_back(__return_storage_ptr__,&__lhs->group);
    }
    __gnu_cxx::
    __normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ConfigurationGroup*> ConfigurationGroup::groups(const std::string& name) {
    std::vector<ConfigurationGroup*> found;

    for(Group& group: _groups)
        if(group.name == name) found.push_back(group.group);

    return found;
}